

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_inst.hpp
# Opt level: O2

string * __thiscall
optimization::cast_inst::Cast_Inst::pass_name_abi_cxx11_
          (string *__return_storage_ptr__,Cast_Inst *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string pass_name() const { return name; }